

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O1

void __thiscall restincurl::Request::OpenSourceFile(Request *this,string *path)

{
  int e;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var1;
  size_type sVar2;
  int *piVar3;
  SystemException *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((this->fp_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    __assert_fail("!fp_",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                  ,0x1e2,"void restincurl::Request::OpenSourceFile(const std::string &)");
  }
  local_68._M_dataplus._M_p = (pointer)fopen((path->_M_dataplus)._M_p,"rb");
  if ((FILE *)local_68._M_dataplus._M_p != (FILE *)0x0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<_IO_FILE*,int(*)(_IO_FILE*),std::allocator<void>,void>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_string_length,
               local_68._M_dataplus._M_p,fclose);
    sVar2 = local_68._M_string_length;
    _Var1._M_p = local_68._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)0x0;
    local_68._M_string_length = 0;
    this_00 = (this->fp_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (this->fp_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var1._M_p;
    (this->fp_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
    }
    return;
  }
  piVar3 = __errno_location();
  e = *piVar3;
  this_01 = (SystemException *)__cxa_allocate_exception(0x18);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Unable to open file ","");
  std::operator+(&local_68,&local_48,path);
  SystemException::SystemException(this_01,&local_68,e);
  __cxa_throw(this_01,&SystemException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

RequestBuilder& Trace(bool enable = true) {
            if (enable) {
                Option(CURLOPT_DEBUGFUNCTION, debug_callback);
                Option(CURLOPT_VERBOSE, 1L);
            } else {
                Option(CURLOPT_VERBOSE, 0L);
            }
            
            return *this;
        }